

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

double evaluate_CAI_N(string *rna,vector<int,_std::allocator<int>_> *protein,int type)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  vector<int,_std::allocator<int>_> seq;
  allocator_type local_61;
  double local_60;
  vector<int,_std::allocator<int>_> local_58;
  undefined1 *local_40;
  int local_38;
  undefined1 local_30 [16];
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_58,(long)(int)rna->_M_string_length,&local_61);
  pcVar1 = (rna->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + rna->_M_string_length);
  if (0 < local_38) {
    lVar3 = 0;
    do {
      iVar2 = n_index(local_40[lVar3]);
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar3] = iVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < local_38);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (type == 1) {
    local_60 = getCAI_s(&local_58,protein);
  }
  else {
    local_60 = stand_getCAI_s(&local_58,protein);
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_60;
}

Assistant:

double evaluate_CAI_N(string & rna,vector<int> & protein,int type) {
    int l = int(rna.size());
    vector<int> seq(l);
    transform2num(seq,rna);
    double CAI;
    if (type == 1) CAI = getCAI_s(seq, protein);
    else CAI = stand_getCAI_s(seq, protein);
    return CAI;
}